

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O2

shared_ptr<slang::syntax::SyntaxTree>
slang::syntax::SyntaxTree::fromText
          (string_view text,SourceManager *sourceManager,string_view name,string_view path,
          Bag *options,SourceLibrary *library)

{
  SourceManager *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  SourceLocation location;
  element_type *sourceManager_00;
  shared_ptr<slang::syntax::SyntaxTree> sVar2;
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources;
  string_view name_00;
  string_view text_00;
  MacroList inheritedMacros;
  SourceLibrary *in_stack_00000020;
  SourceBuffer buffer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  sourceManager_00 = (element_type *)text._M_len;
  this = (SourceManager *)name._M_len;
  text_00._M_str = (char *)sourceManager;
  text_00._M_len = (size_t)text._M_str;
  SourceManager::assignText(&buffer,this,path,text_00,(SourceLocation)0x0,in_stack_00000020);
  if (buffer.id.id == 0) {
    *(undefined8 *)sourceManager_00 = 0;
    sourceManager_00->rootNode = (SyntaxNode *)0x0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    if (name._M_str != (char *)0x0) {
      location._0_4_ = buffer.id.id & 0xfffffff;
      location._4_4_ = 0;
      name_00._M_str = (char *)options;
      name_00._M_len = (size_t)name._M_str;
      SourceManager::addLineDirective(this,location,2,name_00,'\0');
    }
    sources._M_extent._M_extent_value = (size_t)&buffer;
    sources._M_ptr = (pointer)this;
    inheritedMacros._M_extent._M_extent_value = 1;
    inheritedMacros._M_ptr = (pointer)library;
    sVar2 = create((SourceManager *)sourceManager_00,sources,(Bag *)0x1,inheritedMacros,false);
    _Var1 = sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       sourceManager_00;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> SyntaxTree::fromText(std::string_view text,
                                                 SourceManager& sourceManager,
                                                 std::string_view name, std::string_view path,
                                                 const Bag& options, const SourceLibrary* library) {
    SourceBuffer buffer = sourceManager.assignText(path, text, {}, library);
    if (!buffer)
        return nullptr;

    if (!name.empty())
        sourceManager.addLineDirective(SourceLocation(buffer.id, 0), 2, name, 0);

    return create(sourceManager, std::span(&buffer, 1), options, {}, true);
}